

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O0

void __thiscall
t_cpp_generator::generate_deserialize_container
          (t_cpp_generator *this,ostream *out,t_type *ttype,string *prefix)

{
  byte bVar1;
  uint uVar2;
  ostream *poVar3;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  allocator local_2a9;
  string local_2a8;
  undefined1 local_288 [8];
  string i;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  string local_1a8;
  string local_188;
  byte local_161;
  t_type *ptStack_160;
  bool use_push;
  t_container *tcontainer;
  string local_150;
  undefined1 local_130 [8];
  string etype;
  string local_108;
  undefined1 local_e8 [8];
  string vtype;
  string local_c0;
  undefined1 local_a0 [8];
  string ktype;
  allocator local_69;
  string local_68;
  undefined1 local_48 [8];
  string size;
  string *prefix_local;
  t_type *ttype_local;
  ostream *out_local;
  t_cpp_generator *this_local;
  
  size.field_2._8_8_ = prefix;
  t_oop_generator::scope_up(&this->super_t_oop_generator,out);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,"_size",&local_69);
  t_generator::tmp((string *)local_48,(t_generator *)this,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_c0,"_ktype",(allocator *)(vtype.field_2._M_local_buf + 0xf));
  t_generator::tmp((string *)local_a0,(t_generator *)this,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator((allocator<char> *)(vtype.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_108,"_vtype",(allocator *)(etype.field_2._M_local_buf + 0xf));
  t_generator::tmp((string *)local_e8,(t_generator *)this,&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator((allocator<char> *)(etype.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_150,"_etype",(allocator *)((long)&tcontainer + 7));
  t_generator::tmp((string *)local_130,(t_generator *)this,&local_150);
  std::__cxx11::string::~string((string *)&local_150);
  std::allocator<char>::~allocator((allocator<char> *)((long)&tcontainer + 7));
  ptStack_160 = ttype;
  local_161 = t_container::has_cpp_name((t_container *)ttype);
  poVar3 = t_generator::indent((t_generator *)this,out);
  poVar3 = std::operator<<(poVar3,(string *)prefix);
  poVar3 = std::operator<<(poVar3,".clear();");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_188,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_188);
  poVar3 = std::operator<<(poVar3,"uint32_t ");
  poVar3 = std::operator<<(poVar3,(string *)local_48);
  poVar3 = std::operator<<(poVar3,";");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_188);
  uVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])();
  if ((uVar2 & 1) == 0) {
    uVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])();
    if ((uVar2 & 1) == 0) {
      uVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])();
      if ((uVar2 & 1) != 0) {
        t_generator::indent_abi_cxx11_(&local_248,(t_generator *)this);
        poVar3 = std::operator<<(out,(string *)&local_248);
        poVar3 = std::operator<<(poVar3,"::apache::thrift::protocol::TType ");
        poVar3 = std::operator<<(poVar3,(string *)local_130);
        poVar3 = std::operator<<(poVar3,";");
        poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_((string *)((long)&i.field_2 + 8),(t_generator *)this);
        poVar3 = std::operator<<(poVar3,(string *)(i.field_2._M_local_buf + 8));
        poVar3 = std::operator<<(poVar3,"xfer += iprot->readListBegin(");
        poVar3 = std::operator<<(poVar3,(string *)local_130);
        poVar3 = std::operator<<(poVar3,", ");
        poVar3 = std::operator<<(poVar3,(string *)local_48);
        poVar3 = std::operator<<(poVar3,");");
        std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)(i.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)&local_248);
        if ((local_161 & 1) == 0) {
          poVar3 = t_generator::indent((t_generator *)this,out);
          poVar3 = std::operator<<(poVar3,(string *)prefix);
          poVar3 = std::operator<<(poVar3,".resize(");
          poVar3 = std::operator<<(poVar3,(string *)local_48);
          poVar3 = std::operator<<(poVar3,");");
          std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
        }
      }
    }
    else {
      t_generator::indent_abi_cxx11_(&local_208,(t_generator *)this);
      poVar3 = std::operator<<(out,(string *)&local_208);
      poVar3 = std::operator<<(poVar3,"::apache::thrift::protocol::TType ");
      poVar3 = std::operator<<(poVar3,(string *)local_130);
      poVar3 = std::operator<<(poVar3,";");
      poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_228,(t_generator *)this);
      poVar3 = std::operator<<(poVar3,(string *)&local_228);
      poVar3 = std::operator<<(poVar3,"xfer += iprot->readSetBegin(");
      poVar3 = std::operator<<(poVar3,(string *)local_130);
      poVar3 = std::operator<<(poVar3,", ");
      poVar3 = std::operator<<(poVar3,(string *)local_48);
      poVar3 = std::operator<<(poVar3,");");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_228);
      std::__cxx11::string::~string((string *)&local_208);
    }
  }
  else {
    t_generator::indent_abi_cxx11_(&local_1a8,(t_generator *)this);
    poVar3 = std::operator<<(out,(string *)&local_1a8);
    poVar3 = std::operator<<(poVar3,"::apache::thrift::protocol::TType ");
    poVar3 = std::operator<<(poVar3,(string *)local_a0);
    poVar3 = std::operator<<(poVar3,";");
    poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_1c8,(t_generator *)this);
    poVar3 = std::operator<<(poVar3,(string *)&local_1c8);
    poVar3 = std::operator<<(poVar3,"::apache::thrift::protocol::TType ");
    poVar3 = std::operator<<(poVar3,(string *)local_e8);
    poVar3 = std::operator<<(poVar3,";");
    poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_1e8,(t_generator *)this);
    poVar3 = std::operator<<(poVar3,(string *)&local_1e8);
    poVar3 = std::operator<<(poVar3,"xfer += iprot->readMapBegin(");
    poVar3 = std::operator<<(poVar3,(string *)local_a0);
    poVar3 = std::operator<<(poVar3,", ");
    poVar3 = std::operator<<(poVar3,(string *)local_e8);
    poVar3 = std::operator<<(poVar3,", ");
    poVar3 = std::operator<<(poVar3,(string *)local_48);
    poVar3 = std::operator<<(poVar3,");");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_1a8);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2a8,"_i",&local_2a9);
  t_generator::tmp((string *)local_288,(t_generator *)this,&local_2a8);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a9);
  t_generator::indent_abi_cxx11_(&local_2d0,(t_generator *)this);
  poVar3 = std::operator<<(out,(string *)&local_2d0);
  poVar3 = std::operator<<(poVar3,"uint32_t ");
  poVar3 = std::operator<<(poVar3,(string *)local_288);
  poVar3 = std::operator<<(poVar3,";");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_2f0,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_2f0);
  poVar3 = std::operator<<(poVar3,"for (");
  poVar3 = std::operator<<(poVar3,(string *)local_288);
  poVar3 = std::operator<<(poVar3," = 0; ");
  poVar3 = std::operator<<(poVar3,(string *)local_288);
  poVar3 = std::operator<<(poVar3," < ");
  poVar3 = std::operator<<(poVar3,(string *)local_48);
  poVar3 = std::operator<<(poVar3,"; ++");
  poVar3 = std::operator<<(poVar3,(string *)local_288);
  poVar3 = std::operator<<(poVar3,")");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::string::~string((string *)&local_2d0);
  t_oop_generator::scope_up(&this->super_t_oop_generator,out);
  uVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])();
  if ((uVar2 & 1) == 0) {
    uVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])();
    if ((uVar2 & 1) == 0) {
      uVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])();
      if ((uVar2 & 1) != 0) {
        std::__cxx11::string::string((string *)&local_350,(string *)prefix);
        bVar1 = local_161;
        std::__cxx11::string::string((string *)&local_370,(string *)local_288);
        generate_deserialize_list_element
                  (this,out,(t_list *)ttype,&local_350,(bool)(bVar1 & 1),&local_370);
        std::__cxx11::string::~string((string *)&local_370);
        std::__cxx11::string::~string((string *)&local_350);
      }
    }
    else {
      std::__cxx11::string::string((string *)&local_330,(string *)prefix);
      generate_deserialize_set_element(this,out,(t_set *)ttype,&local_330);
      std::__cxx11::string::~string((string *)&local_330);
    }
  }
  else {
    std::__cxx11::string::string((string *)&local_310,(string *)prefix);
    generate_deserialize_map_element(this,out,(t_map *)ttype,&local_310);
    std::__cxx11::string::~string((string *)&local_310);
  }
  t_oop_generator::scope_down(&this->super_t_oop_generator,out);
  uVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])();
  if ((uVar2 & 1) == 0) {
    uVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])();
    if ((uVar2 & 1) == 0) {
      uVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])();
      if ((uVar2 & 1) != 0) {
        poVar3 = t_generator::indent((t_generator *)this,out);
        poVar3 = std::operator<<(poVar3,"xfer += iprot->readListEnd();");
        std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      }
    }
    else {
      poVar3 = t_generator::indent((t_generator *)this,out);
      poVar3 = std::operator<<(poVar3,"xfer += iprot->readSetEnd();");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    }
  }
  else {
    poVar3 = t_generator::indent((t_generator *)this,out);
    poVar3 = std::operator<<(poVar3,"xfer += iprot->readMapEnd();");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  }
  t_oop_generator::scope_down(&this->super_t_oop_generator,out);
  std::__cxx11::string::~string((string *)local_288);
  std::__cxx11::string::~string((string *)local_130);
  std::__cxx11::string::~string((string *)local_e8);
  std::__cxx11::string::~string((string *)local_a0);
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void t_cpp_generator::generate_deserialize_container(ostream& out, t_type* ttype, string prefix) {
  scope_up(out);

  string size = tmp("_size");
  string ktype = tmp("_ktype");
  string vtype = tmp("_vtype");
  string etype = tmp("_etype");

  t_container* tcontainer = (t_container*)ttype;
  bool use_push = tcontainer->has_cpp_name();

  indent(out) << prefix << ".clear();" << endl << indent() << "uint32_t " << size << ";" << endl;

  // Declare variables, read header
  if (ttype->is_map()) {
    out << indent() << "::apache::thrift::protocol::TType " << ktype << ";" << endl << indent()
        << "::apache::thrift::protocol::TType " << vtype << ";" << endl << indent()
        << "xfer += iprot->readMapBegin(" << ktype << ", " << vtype << ", " << size << ");" << endl;
  } else if (ttype->is_set()) {
    out << indent() << "::apache::thrift::protocol::TType " << etype << ";" << endl << indent()
        << "xfer += iprot->readSetBegin(" << etype << ", " << size << ");" << endl;
  } else if (ttype->is_list()) {
    out << indent() << "::apache::thrift::protocol::TType " << etype << ";" << endl << indent()
        << "xfer += iprot->readListBegin(" << etype << ", " << size << ");" << endl;
    if (!use_push) {
      indent(out) << prefix << ".resize(" << size << ");" << endl;
    }
  }

  // For loop iterates over elements
  string i = tmp("_i");
  out << indent() << "uint32_t " << i << ";" << endl << indent() << "for (" << i << " = 0; " << i
      << " < " << size << "; ++" << i << ")" << endl;

  scope_up(out);

  if (ttype->is_map()) {
    generate_deserialize_map_element(out, (t_map*)ttype, prefix);
  } else if (ttype->is_set()) {
    generate_deserialize_set_element(out, (t_set*)ttype, prefix);
  } else if (ttype->is_list()) {
    generate_deserialize_list_element(out, (t_list*)ttype, prefix, use_push, i);
  }

  scope_down(out);

  // Read container end
  if (ttype->is_map()) {
    indent(out) << "xfer += iprot->readMapEnd();" << endl;
  } else if (ttype->is_set()) {
    indent(out) << "xfer += iprot->readSetEnd();" << endl;
  } else if (ttype->is_list()) {
    indent(out) << "xfer += iprot->readListEnd();" << endl;
  }

  scope_down(out);
}